

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  ImGuiWindow *this;
  ImDrawList *draw_list;
  ImVec2 IVar5;
  bool bVar6;
  ImU32 tab_id;
  int iVar7;
  int iVar8;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *it;
  size_t sVar9;
  char *pcVar10;
  uint uVar11;
  ImGuiTabItemFlags flags_00;
  byte bVar12;
  int iVar13;
  ImGuiCol idx;
  ImGuiContext *pIVar14;
  bool is_contents_visible;
  float fVar15;
  float fVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  uint uVar17;
  bool held;
  float local_94;
  ImVec2 local_90;
  ImGuiContext *local_88;
  bool hovered;
  undefined7 uStack_7f;
  float fStack_7c;
  bool *local_78;
  int local_70;
  int local_6c;
  undefined1 local_68 [16];
  ImRect bb;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar14 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return false;
  }
  tab_id = TabBarCalcTabID(tab_bar,label);
  if ((p_open == (bool *)0x0) || (*p_open != false)) {
    local_88 = pIVar14;
    local_78 = (bool *)0x0;
    uVar11 = flags;
    if (((uint)flags >> 0x14 & 1) == 0) {
      local_78 = p_open;
      uVar11 = flags | 0x100000;
    }
    if (p_open != (bool *)0x0) {
      uVar11 = flags;
    }
    IVar5 = TabItemCalcSize(label,local_78 != (bool *)0x0);
    local_68._8_4_ = extraout_XMM0_Dc;
    local_68._0_4_ = IVar5.x;
    local_68._4_4_ = IVar5.y;
    local_68._12_4_ = extraout_XMM0_Dd;
    it = TabBarFindTabByID(tab_bar,tab_id);
    local_90 = (ImVec2)it;
    if (it == (ImGuiTabItem *)0x0) {
      bb.Min.x = 0.0;
      bb.Min.y = 0.0;
      bb.Max.x = -NAN;
      bb.Max.y = -NAN;
      ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
      it = ImVector<ImGuiTabItem>::back(&tab_bar->Tabs);
      it->ID = tab_id;
      it->Width = (float)local_68._0_4_;
    }
    iVar7 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,it);
    tab_bar->LastTabItemIdx = (short)iVar7;
    it->ContentWidth = (float)local_68._0_4_;
    uVar4 = tab_bar->Flags;
    iVar13 = tab_bar->PrevFrameVisible + 1;
    local_6c = local_88->FrameCount;
    local_70 = it->LastFrameVisible + 1;
    it->LastFrameVisible = local_6c;
    it->Flags = uVar11;
    iVar7 = (tab_bar->TabsNames).Buf.Size;
    iVar8 = iVar7 + -1;
    if (iVar7 == 0) {
      iVar8 = 0;
    }
    it->NameOffset = iVar8;
    sVar9 = strlen(label);
    ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar9 + 1);
    pIVar14 = local_88;
    uVar17 = tab_bar->Flags;
    bVar12 = local_70 < local_6c;
    if (local_70 < local_6c) {
      if ((((uVar17 & 2) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
         ((local_6c <= iVar13 || (tab_bar->SelectedTabId == 0)))) {
        tab_bar->NextSelectedTabId = tab_id;
      }
    }
    else if ((uVar17 & 1) == 0) {
      fVar2 = tab_bar->OffsetNextTab;
      it->Offset = fVar2;
      tab_bar->OffsetNextTab = it->Width + (local_88->Style).ItemInnerSpacing.x + fVar2;
    }
    if (((uVar11 & 2) != 0) && (tab_bar->SelectedTabId != tab_id)) {
      tab_bar->NextSelectedTabId = tab_id;
    }
    if (tab_bar->VisibleTabId == tab_id) {
      tab_bar->VisibleTabWasSubmitted = true;
      is_contents_visible = true;
    }
    else if ((tab_bar->SelectedTabId == 0 && iVar13 < local_6c) && ((tab_bar->Tabs).Size == 1)) {
      is_contents_visible = (uVar17 & 2) == 0;
    }
    else {
      is_contents_visible = false;
    }
    if ((local_6c <= local_70) || (local_90 != (ImVec2)0x0 && iVar13 < local_6c)) {
      if (tab_bar->SelectedTabId == tab_id) {
        it->LastFrameSelected = local_88->FrameCount;
      }
      local_90 = (this->DC).CursorPos;
      fVar2 = it->Width;
      IVar5 = (tab_bar->BarRect).Min;
      fVar15 = (float)(int)(it->Offset - tab_bar->ScrollingAnim) + IVar5.x;
      fVar16 = IVar5.y + 0.0;
      IVar5.y = fVar16;
      IVar5.x = fVar15;
      (this->DC).CursorPos = IVar5;
      bb.Max.x = fVar2 + fVar15;
      bb.Max.y = (float)local_68._4_4_ + fVar16;
      bb.Min.y = fVar16;
      bb.Min.x = fVar15;
      fVar2 = (tab_bar->BarRect).Min.x;
      fVar3 = (tab_bar->BarRect).Max.x;
      uVar17 = -(uint)(fVar15 < fVar2 || fVar3 < bb.Max.x);
      local_68._0_4_ = uVar17;
      if ((uVar17 & 1) != 0) {
        fStack_7c = fVar16 + -1.0;
        _hovered = (float)(~-(uint)(fVar2 <= fVar15) & (uint)fVar2 |
                          -(uint)(fVar2 <= fVar15) & (uint)fVar15);
        _held = fVar3;
        local_94 = bb.Max.y;
        PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
        fVar15 = bb.Min.x;
        fVar16 = bb.Min.y;
      }
      _hovered = bb.Max.x - fVar15;
      fStack_7c = bb.Max.y - fVar16;
      IVar5 = (this->DC).CursorMaxPos;
      ItemSize((ImVec2 *)&hovered,(pIVar14->Style).FramePadding.y);
      (this->DC).CursorMaxPos = IVar5;
      bVar6 = ItemAdd(&bb,tab_id,(ImRect *)0x0);
      if (!bVar6) {
        if ((local_68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          PopClipRect();
        }
        (this->DC).CursorPos = local_90;
        return is_contents_visible;
      }
      bVar6 = ButtonBehavior(&bb,tab_id,&hovered,&held,(uint)pIVar14->DragDropActive << 6 | 0x102);
      if (bVar6) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      hovered = (bool)(hovered | pIVar14->HoveredId == tab_id);
      if (held == false) {
        bVar6 = local_70 < local_6c;
        SetItemAllowOverlap();
        bVar12 = held ^ 1U | bVar6;
        pIVar14 = local_88;
      }
      if (((((bVar12 & 1) == 0) && (bVar6 = IsMouseDragging(0,-1.0), bVar6)) &&
          (pIVar14->DragDropActive == false)) && ((tab_bar->Flags & 1) != 0)) {
        fVar2 = (pIVar14->IO).MouseDelta.x;
        if ((0.0 <= fVar2) ||
           (pIVar1 = &(pIVar14->IO).MousePos, bb.Min.x < pIVar1->x || bb.Min.x == pIVar1->x)) {
          if ((fVar2 <= 0.0) || ((pIVar14->IO).MousePos.x <= bb.Max.x)) goto LAB_001c31f5;
          iVar7 = 1;
        }
        else {
          iVar7 = -1;
        }
        TabBarQueueChangeTabOrder(tab_bar,it,iVar7);
      }
LAB_001c31f5:
      draw_list = this->DrawList;
      idx = 0x22;
      if ((held == false) && (hovered == false)) {
        if (is_contents_visible == false) {
          idx = (uint)((uVar4 >> 0x15 & 1) == 0) * 3 + 0x21;
        }
        else {
          idx = (uint)((uVar4 >> 0x15 & 1) == 0) * 2 + 0x23;
        }
      }
      col = GetColorU32(idx,1.0);
      TabItemBackground(draw_list,&bb,flags_00,col);
      RenderNavHighlight(&bb,tab_id,1);
      bVar6 = IsItemHovered(8);
      if ((bVar6) &&
         ((bVar6 = IsMouseClicked(1,false), bVar6 || (bVar6 = IsMouseReleased(1), bVar6)))) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      uVar4 = tab_bar->Flags;
      if (local_78 == (bool *)0x0) {
        close_button_id = 0;
      }
      else {
        close_button_id = ImGuiWindow::GetID(this,(void *)((ulong)tab_id + 1));
      }
      bVar6 = TabItemLabelAndCloseButton
                        (draw_list,&bb,uVar4 >> 1 & 4 | uVar11,tab_bar->FramePadding,label,tab_id,
                         close_button_id,is_contents_visible);
      if ((local_78 != (bool *)0x0) && (bVar6)) {
        *local_78 = false;
        TabBarCloseTab(tab_bar,it);
      }
      if ((local_68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        PopClipRect();
      }
      (this->DC).CursorPos = local_90;
      if (pIVar14->HoveredId != tab_id) {
        return is_contents_visible;
      }
      if (held != false) {
        return is_contents_visible;
      }
      if (pIVar14->HoveredIdNotActiveTimer <= 0.5) {
        return is_contents_visible;
      }
      bVar6 = IsItemHovered(0);
      if (!bVar6) {
        return is_contents_visible;
      }
      if ((tab_bar->Flags & 0x20) != 0) {
        return is_contents_visible;
      }
      if ((it->Flags & 0x10) != 0) {
        return is_contents_visible;
      }
      pcVar10 = FindRenderedTextEnd(label,(char *)0x0);
      SetTooltip("%.*s",(ulong)(uint)((int)pcVar10 - (int)label),label);
      return is_contents_visible;
    }
    PushItemFlag(0x18,true);
  }
  else {
    PushItemFlag(0x18,true);
    is_contents_visible = false;
  }
  bb.Max.x = 0.0;
  bb.Max.y = 0.0;
  bb.Min.x = 0.0;
  bb.Min.y = 0.0;
  ItemAdd(&bb,tab_id,(ImRect *)0x0);
  PopItemFlag();
  return is_contents_visible;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}